

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

HttpHeaderId __thiscall kj::HttpHeaderTable::Builder::add(Builder *this,StringPtr name)

{
  RemoveConst<kj::StringPtr> **ppRVar1;
  HttpHeaderTable *pHVar2;
  RemoveConst<kj::StringPtr> *pRVar3;
  _Hashtable<kj::StringPtr,_std::pair<const_kj::StringPtr,_unsigned_int>,_std::allocator<std::pair<const_kj::StringPtr,_unsigned_int>_>,_std::__detail::_Select1st,_kj::(anonymous_namespace)::HeaderNameHash,_kj::(anonymous_namespace)::HeaderNameHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *this_00;
  StringPtr *pSVar4;
  StringPtr *pSVar5;
  __node_ptr __node;
  __node_ptr p_Var6;
  char *pcVar7;
  ulong __bkt;
  pointer __ptr_1;
  __node_ptr p_Var8;
  anon_unknown_36 *this_01;
  __hash_code __c;
  size_t newSize;
  size_type in_R8;
  HttpHeaderId HVar9;
  StringPtr name_00;
  
  name_00.content.size_ = (char *)name.content.size_;
  this_01 = (anon_unknown_36 *)name.content.ptr;
  name_00.content.ptr = name_00.content.size_;
  anon_unknown_36::requireValidHeaderName(this_01,name_00);
  pHVar2 = (this->table).ptr;
  pRVar3 = (pHVar2->namesById).builder.pos;
  this_00 = (_Hashtable<kj::StringPtr,_std::pair<const_kj::StringPtr,_unsigned_int>,_std::allocator<std::pair<const_kj::StringPtr,_unsigned_int>_>,_std::__detail::_Select1st,_kj::(anonymous_namespace)::HeaderNameHash,_kj::(anonymous_namespace)::HeaderNameHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             *)(pHVar2->idsByName).ptr;
  pSVar4 = (pHVar2->namesById).builder.ptr;
  __node = (__node_ptr)operator_new(0x28);
  (__node->super__Hash_node_base)._M_nxt = (_Hash_node_base *)0x0;
  *(anon_unknown_36 **)
   &(__node->super__Hash_node_value<std::pair<const_kj::StringPtr,_unsigned_int>,_true>).
    super__Hash_node_value_base<std::pair<const_kj::StringPtr,_unsigned_int>_>._M_storage._M_storage
       = this_01;
  *(char **)((long)&(__node->
                    super__Hash_node_value<std::pair<const_kj::StringPtr,_unsigned_int>,_true>).
                    super__Hash_node_value_base<std::pair<const_kj::StringPtr,_unsigned_int>_>.
                    _M_storage._M_storage + 8) = name_00.content.size_;
  *(int *)((long)&(__node->
                  super__Hash_node_value<std::pair<const_kj::StringPtr,_unsigned_int>,_true>).
                  super__Hash_node_value_base<std::pair<const_kj::StringPtr,_unsigned_int>_>.
                  _M_storage._M_storage + 0x10) = (int)((ulong)((long)pRVar3 - (long)pSVar4) >> 4);
  if (this_01 + (long)name_00.content.size_ + -1 == this_01) {
    __c = 0x1505;
  }
  else {
    __c = 0x1505;
    pcVar7 = (char *)0x0;
    do {
      __c = (ulong)((byte)this_01[(long)pcVar7] & 0xffffffdf) ^ __c * 0x21;
      pcVar7 = pcVar7 + 1;
    } while (name_00.content.size_ + -1 != pcVar7);
  }
  __bkt = __c % this_00->_M_bucket_count;
  p_Var6 = std::
           _Hashtable<kj::StringPtr,_std::pair<const_kj::StringPtr,_unsigned_int>,_std::allocator<std::pair<const_kj::StringPtr,_unsigned_int>_>,_std::__detail::_Select1st,_kj::(anonymous_namespace)::HeaderNameHash,_kj::(anonymous_namespace)::HeaderNameHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_node(this_00,__bkt,
                          (key_type *)
                          &__node->
                           super__Hash_node_value<std::pair<const_kj::StringPtr,_unsigned_int>,_true>
                          ,__c);
  p_Var8 = p_Var6;
  if (p_Var6 == (__node_ptr)0x0) {
    std::
    _Hashtable<kj::StringPtr,_std::pair<const_kj::StringPtr,_unsigned_int>,_std::allocator<std::pair<const_kj::StringPtr,_unsigned_int>_>,_std::__detail::_Select1st,_kj::(anonymous_namespace)::HeaderNameHash,_kj::(anonymous_namespace)::HeaderNameHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_M_insert_unique_node(this_00,__bkt,__c,__node,in_R8);
    p_Var8 = __node;
    __node = (__node_ptr)0x0;
  }
  if (__node != (__node_ptr)0x0) {
    operator_delete(__node,0x28);
  }
  if (p_Var6 == (__node_ptr)0x0) {
    pHVar2 = (this->table).ptr;
    pSVar4 = (pHVar2->namesById).builder.endPtr;
    if ((pHVar2->namesById).builder.pos == pSVar4) {
      pSVar5 = (pHVar2->namesById).builder.ptr;
      newSize = 4;
      if (pSVar4 != pSVar5) {
        newSize = (long)pSVar4 - (long)pSVar5 >> 3;
      }
      Vector<kj::StringPtr>::setCapacity(&pHVar2->namesById,newSize);
    }
    pRVar3 = (pHVar2->namesById).builder.pos;
    (pRVar3->content).ptr = (char *)this_01;
    (pRVar3->content).size_ = (size_t)name_00.content.size_;
    ppRVar1 = &(pHVar2->namesById).builder.pos;
    *ppRVar1 = *ppRVar1 + 1;
  }
  HVar9.id = *(undefined4 *)
              ((long)&(p_Var8->
                      super__Hash_node_value<std::pair<const_kj::StringPtr,_unsigned_int>,_true>).
                      super__Hash_node_value_base<std::pair<const_kj::StringPtr,_unsigned_int>_>.
                      _M_storage._M_storage + 0x10);
  HVar9.table = (this->table).ptr;
  HVar9._12_4_ = 0;
  return HVar9;
}

Assistant:

HttpHeaderId HttpHeaderTable::Builder::add(kj::StringPtr name) {
  requireValidHeaderName(name);

  auto insertResult = table->idsByName->map.insert(std::make_pair(name, table->namesById.size()));
  if (insertResult.second) {
    table->namesById.add(name);
  }
  return HttpHeaderId(table, insertResult.first->second);
}